

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O1

NewClassExpressionSyntax * __thiscall
slang::BumpAllocator::
emplace<slang::syntax::NewClassExpressionSyntax,slang::syntax::NameSyntax&,slang::syntax::ArgumentListSyntax*&>
          (BumpAllocator *this,NameSyntax *args,ArgumentListSyntax **args_1)

{
  ArgumentListSyntax *pAVar1;
  NewClassExpressionSyntax *pNVar2;
  
  pNVar2 = (NewClassExpressionSyntax *)((ulong)(this->head->current + 7) & 0xfffffffffffffff8);
  if ((NewClassExpressionSyntax *)this->endPtr < pNVar2 + 1) {
    pNVar2 = (NewClassExpressionSyntax *)allocateSlow(this,0x20,8);
  }
  else {
    this->head->current = (byte *)(pNVar2 + 1);
  }
  pAVar1 = *args_1;
  (pNVar2->super_ExpressionSyntax).super_SyntaxNode.parent = (SyntaxNode *)0x0;
  (pNVar2->super_ExpressionSyntax).super_SyntaxNode.kind = NewClassExpression;
  (pNVar2->scopedNew).ptr = args;
  pNVar2->argList = pAVar1;
  (args->super_ExpressionSyntax).super_SyntaxNode.parent = (SyntaxNode *)pNVar2;
  if (pAVar1 != (ArgumentListSyntax *)0x0) {
    (pAVar1->super_SyntaxNode).parent = (SyntaxNode *)pNVar2;
  }
  return pNVar2;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }